

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_recover
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,
              secp256k1_ecdsa_recoverable_signature *signature,uchar *msg32)

{
  int iVar1;
  int local_ec;
  undefined1 local_e8 [4];
  int recid;
  secp256k1_scalar m;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ge q;
  uchar *msg32_local;
  secp256k1_ecdsa_recoverable_signature *signature_local;
  secp256k1_pubkey *pubkey_local;
  secp256k1_context *ctx_local;
  
  iVar1 = secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call
              (&ctx->illegal_callback,"secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx)");
    ctx_local._4_4_ = 0;
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"msg32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (signature == (secp256k1_ecdsa_recoverable_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"signature != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_ecdsa_recoverable_signature_load
              (ctx,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)(m.d + 3),&local_ec,signature);
    secp256k1_scalar_set_b32((secp256k1_scalar *)local_e8,msg32,(int *)0x0);
    iVar1 = secp256k1_ecdsa_sig_recover
                      (&ctx->ecmult_ctx,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)(m.d + 3),
                       (secp256k1_ge *)(r.d + 3),(secp256k1_scalar *)local_e8,local_ec);
    if (iVar1 == 0) {
      memset(pubkey,0,0x40);
      ctx_local._4_4_ = 0;
    }
    else {
      secp256k1_pubkey_save(pubkey,(secp256k1_ge *)(r.d + 3));
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_recover(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const secp256k1_ecdsa_recoverable_signature *signature, const unsigned char *msg32) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    int recid;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_ecdsa_recoverable_signature_load(ctx, &r, &s, &recid, signature);
    VERIFY_CHECK(recid >= 0 && recid < 4);  /* should have been caught in parse_compact */
    secp256k1_scalar_set_b32(&m, msg32, NULL);
    if (secp256k1_ecdsa_sig_recover(&ctx->ecmult_ctx, &r, &s, &q, &m, recid)) {
        secp256k1_pubkey_save(pubkey, &q);
        return 1;
    } else {
        memset(pubkey, 0, sizeof(*pubkey));
        return 0;
    }
}